

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O1

void slide(char *r,uint8_t *a)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  
  uVar3 = 0;
  do {
    r[uVar3] = (a[uVar3 >> 3 & 0x1fffffff] >> ((uint)uVar3 & 7) & 1) != 0;
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x100);
  lVar4 = 1;
  uVar3 = 0;
  do {
    if (uVar3 < 0xff && r[uVar3] != '\0') {
      uVar5 = 1;
      uVar6 = uVar3;
      lVar7 = lVar4;
      do {
        if (r[lVar7] != '\0') {
          iVar8 = (int)r[lVar7] << ((byte)uVar5 & 0x1f);
          iVar1 = iVar8 + r[uVar3];
          if (iVar1 < 0x10) {
            r[uVar3] = (char)iVar1;
            r[lVar7] = '\0';
          }
          else {
            iVar8 = r[uVar3] - iVar8;
            if (iVar8 < -0xf) break;
            r[uVar3] = (char)iVar8;
            uVar9 = uVar6;
            do {
              if (r[uVar9 + 1] == '\0') {
                r[uVar9 + 1] = '\x01';
                break;
              }
              r[uVar9 + 1] = '\0';
              uVar9 = uVar9 + 1;
            } while (uVar9 < 0xff);
          }
        }
        if (5 < uVar5) break;
        lVar7 = lVar7 + 1;
        uVar6 = uVar6 + 1;
        lVar2 = uVar5 + uVar3;
        uVar5 = uVar5 + 1;
      } while (lVar2 + 1U < 0x100);
    }
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 1;
    if (uVar3 == 0x100) {
      return;
    }
  } while( true );
}

Assistant:

static void slide(signed char *r, const uint8_t *a) {
  int i;
  int b;
  int k;

  for (i = 0; i < 256; ++i) {
    r[i] = 1 & (a[i >> 3] >> (i & 7));
  }

  for (i = 0; i < 256; ++i) {
    if (r[i]) {
      for (b = 1; b <= 6 && i + b < 256; ++b) {
        if (r[i + b]) {
          if (r[i] + (r[i + b] << b) <= 15) {
            r[i] += r[i + b] << b;
            r[i + b] = 0;
          } else if (r[i] - (r[i + b] << b) >= -15) {
            r[i] -= r[i + b] << b;
            for (k = i + b; k < 256; ++k) {
              if (!r[k]) {
                r[k] = 1;
                break;
              }
              r[k] = 0;
            }
          } else {
            break;
          }
        }
      }
    }
  }
}